

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

char * util::wtf8_find_end(char *begin,char *end)

{
  char *in_RSI;
  char *in_RDI;
  size_t expected;
  unicode_char chr;
  char *i;
  bool local_31;
  ulong local_30;
  char *local_20;
  char *local_8;
  
  local_20 = in_RSI;
  while( true ) {
    local_31 = false;
    if (local_20 != in_RDI) {
      local_31 = anon_unknown_0::is_utf8_continuation_byte((uint)(byte)local_20[-1]);
    }
    if (local_31 == false) break;
    local_20 = local_20 + -1;
  }
  local_8 = in_RSI;
  if ((local_20 != in_RDI) &&
     (local_30 = (ulong)((local_20[-1] & 0x80U) != 0),
     (ulong)((long)in_RSI - (long)local_20) < local_30)) {
    local_8 = local_20 + -1;
  }
  return local_8;
}

Assistant:

const char * wtf8_find_end(const char * begin, const char * end) {
	
	const char * i = end;
	while(i != begin && is_utf8_continuation_byte(boost::uint8_t(*(i - 1)))) {
		i--;
	}
	
	if(i != begin) {
		unicode_char chr = boost::uint8_t(*(i - 1));
		size_t expected = 0;
		if(chr & (1 << 7)) {
			expected++;
			if(chr & (1 << (5 + 6))) {
				expected++;
				if(chr & (1 << (4 + 6 + 6))) {
					expected++;
				}
			}
		}
		if(expected > size_t(end - i)) {
			return i - 1;
		}
	}
	
	return end;
}